

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O2

void rand_pos(int n)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int quad [4];
  
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    quad[lVar3] = 0;
  }
  uVar6 = (ulong)(uint)n;
  if (n < 1) {
    uVar6 = 0;
  }
  for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    iVar1 = rand();
    iVar4 = (int)((long)iVar1 % 4);
    uVar5 = (long)iVar1 % 4 & 0xffffffff;
    lVar3 = (long)iVar4;
    if (quad[lVar3] != 0) {
      iVar1 = 1;
      while (iVar4 = (int)uVar5, iVar1 != 0) {
        uVar5 = (ulong)(iVar4 + 1U);
        if (iVar4 + 1U == 4) {
          uVar5 = 0;
        }
        iVar1 = quad[(int)uVar5];
      }
      lVar3 = (long)iVar4;
    }
    quad[lVar3] = 1;
    iVar1 = rand();
    iVar1 = (iVar4 % 2) * 5000 + iVar1 % 5000;
    robots[uVar7].x = iVar1;
    robots[uVar7].org_x = iVar1;
    iVar2 = rand();
    iVar1 = iVar2 % 5000 + 5000;
    if (1 < iVar4) {
      iVar1 = iVar2 % 5000;
    }
    robots[uVar7].y = iVar1;
    robots[uVar7].org_y = iVar1;
  }
  return;
}

Assistant:

void rand_pos(int n)
{
	int i, k;
	int quad[4];

	for (i = 0; i < 4; i++) {
		quad[i] = 0;
	}

	/* get a new quadrant */
	for (i = 0; i < n; i++) {
		k = rand() % 4;
		if (quad[k] == 0)
			quad[k] = 1;
		else {
			while (quad[k] != 0) {
				if (++k == 4)
					k = 0;
			}
			quad[k] = 1;
		}
		robots[i].org_x = robots[i].x =
			(rand() % (MAX_X * CLICK / 2)) + ((MAX_X * CLICK / 2) * (k % 2));
		robots[i].org_y = robots[i].y =
			(rand() % (MAX_Y * CLICK / 2)) + ((MAX_Y * CLICK / 2) * (k<2));
	}
}